

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

void lys_parse_set_filename(ly_ctx *ctx,char **filename,int fd)

{
  ssize_t sVar1;
  char *pcVar2;
  undefined4 in_register_00000014;
  char local_1048 [8];
  char path [4096];
  char proc_path [32];
  
  sprintf(path + 0xff8,"/proc/self/fd/%d",CONCAT44(in_register_00000014,fd));
  sVar1 = readlink(path + 0xff8,local_1048,0xfff);
  if (0 < (int)(uint)sVar1) {
    pcVar2 = lydict_insert(ctx,local_1048,(ulong)((uint)sVar1 & 0x7fffffff));
    *filename = pcVar2;
  }
  return;
}

Assistant:

static void
lys_parse_set_filename(struct ly_ctx *ctx, const char **filename, int fd)
{
#ifdef __APPLE__
    char path[MAXPATHLEN];
#else
    int len;
    char path[PATH_MAX], proc_path[32];
#endif

#ifdef __APPLE__
    if (fcntl(fd, F_GETPATH, path) != -1) {
        *filename = lydict_insert(ctx, path, 0);
    }
#else
    /* get URI if there is /proc */
    sprintf(proc_path, "/proc/self/fd/%d", fd);
    if ((len = readlink(proc_path, path, PATH_MAX - 1)) > 0) {
        *filename = lydict_insert(ctx, path, len);
    }
#endif
}